

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O1

void __thiscall anon_func::Mapper::~Mapper(Mapper *this)

{
  Task *pTVar1;
  array<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_10UL> *paVar2;
  TaskFunc p_Var3;
  Info *pIVar4;
  
  (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
  super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.replacep = (Expression **)&PTR__Mapper_00d8a438
  ;
  p_Var3 = this[1].super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
           super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.fixed._M_elems[1].func;
  if (p_Var3 != (TaskFunc)0x0) {
    paVar2 = &this[1].super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
              super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.fixed;
    (*p_Var3)((Mapper *)paVar2,(Expression **)paVar2);
  }
  pIVar4 = this->info;
  if (pIVar4 != (Info *)0x0) {
    operator_delete(pIVar4,*(long *)((long)&(this->work).super__Function_base._M_functor + 8) -
                           (long)pIVar4);
  }
  (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
  super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.replacep = (Expression **)&PTR__Pass_00d87048;
  p_Var3 = (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
           super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.fixed._M_elems[0].func;
  pTVar1 = (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
           super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.fixed._M_elems + 1;
  if ((Task *)p_Var3 != pTVar1) {
    operator_delete(p_Var3,(ulong)(pTVar1->func + 1));
  }
  operator_delete(this,0x138);
  return;
}

Assistant:

bool modifiesBinaryenIR() override { return Mut; }